

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::DeadReckoningParameter::Decode(DeadReckoningParameter *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *stream_00;
  ushort local_50;
  KUINT16 i;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  DeadReckoningParameter *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x28) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  KDataStream::operator>>(local_18,&this->m_ui8DeadRecknoningAlgorithm);
  for (local_50 = 0; local_50 < 0xf; local_50 = local_50 + 1) {
    KDataStream::operator>>(local_18,this->m_OtherParams + local_50);
  }
  stream_00 = operator>>(local_18,&(this->m_LinearAcceleration).super_DataTypeBase);
  operator>>(stream_00,&(this->m_AngularVelocity).super_DataTypeBase);
  return;
}

Assistant:

void DeadReckoningParameter::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < DEAD_RECKONING_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8DeadRecknoningAlgorithm;

    for( KUINT16 i = 0; i < 15; ++i )
    {
        stream >> m_OtherParams[i];
    }

    stream >> KDIS_STREAM m_LinearAcceleration
           >> KDIS_STREAM m_AngularVelocity;
}